

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  __m128i *palVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  ulong uVar10;
  ulong uVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  uint uVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int32_t *ptr_00;
  __m128i *palVar55;
  undefined8 *puVar56;
  int iVar57;
  int32_t t_00;
  size_t len;
  int iVar58;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar65;
  uint uVar66;
  int iVar67;
  int iVar68;
  ulong uVar64;
  uint uVar69;
  uint uVar70;
  int iVar71;
  int iVar72;
  uint uVar74;
  uint uVar75;
  int iVar76;
  int iVar77;
  ulong uVar73;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  __m128i alVar83;
  __m128i alVar84;
  __m128i alVar85;
  __m128i alVar86;
  __m128i alVar87;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int local_1300;
  int local_12f4;
  int32_t local_12f0;
  int local_12e4;
  long local_12e0;
  int local_12d8;
  int local_12d0;
  int local_12cc;
  ulong uStack_12c8;
  __m128i vHL_2;
  __m128i vHS_2;
  __m128i vHM_2;
  __m128i vH_2;
  int32_t temp;
  int32_t column_len;
  int32_t *l;
  int32_t *s;
  int32_t *m;
  int32_t *t;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond_max;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int32_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxHL;
  __m128i vMaxHS;
  __m128i vMaxHM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m128i vOne;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_988;
  int iStack_984;
  int iStack_980;
  int iStack_97c;
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_878;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  uint local_7d8;
  uint uStack_7d4;
  uint uStack_7d0;
  uint uStack_7cc;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int local_708;
  int iStack_704;
  int iStack_700;
  int iStack_6fc;
  uint local_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  ulong uStack_50;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32"
            ,"profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32"
            ,"profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32"
            ,"profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32","profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32"
            ,"s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar50 = (iVar1 + 3) / 4;
    iVar58 = (iVar1 + -1) % iVar50;
    uVar51 = ~((iVar1 + -1) / iVar50);
    iVar52 = uVar51 + 4;
    pvVar3 = (profile->profile32).score;
    pvVar4 = (profile->profile32).matches;
    pvVar5 = (profile->profile32).similar;
    if (-open < ppVar2->min) {
      local_12cc = open + -0x80000000;
    }
    else {
      local_12cc = -0x80000000 - ppVar2->min;
    }
    local_12cc = local_12cc + 1;
    iVar53 = 0x7ffffffe - ppVar2->max;
    length = 0;
    vNegLimit[1]._4_4_ = 0;
    vNegLimit[1]._0_4_ = 0;
    lVar19 = CONCAT44(local_12cc,local_12cc);
    lVar20 = CONCAT44(local_12cc,local_12cc);
    vSaturationCheckMax[1] = CONCAT44(iVar53,iVar53);
    vSaturationCheckMin[0] = CONCAT44(iVar53,iVar53);
    vMaxH[0] = lVar20;
    vMaxHM[1] = lVar19;
    vMaxHM[0] = lVar20;
    vMaxHS[1] = lVar19;
    vMaxHS[0] = lVar20;
    vMaxHL[1] = lVar19;
    vMaxHL[0] = lVar20;
    vPosMask[1] = lVar19;
    result._0_4_ = -(uint)(iVar52 == 3);
    result._4_4_ = -(uint)(iVar52 == 2);
    vPosMask[0]._0_4_ = -(uint)(iVar52 == 1);
    vPosMask[0]._4_4_ = -(uint)(uVar51 == 0xfffffffc);
    iVar54 = gap;
    _segNum = (parasail_profile_t *)parasail_result_new_rowcol3(iVar50 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4410802;
      uVar51 = 0;
      if (s1_beg != 0) {
        uVar51 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar51 | *(uint *)&_segNum->field_0xc;
      uVar51 = 0;
      if (s1_end != 0) {
        uVar51 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar51 | *(uint *)&_segNum->field_0xc;
      uVar51 = 0;
      if (s2_beg != 0) {
        uVar51 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar51 | *(uint *)&_segNum->field_0xc;
      uVar51 = 0;
      if (s2_end != 0) {
        uVar51 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar51 | *(uint *)&_segNum->field_0xc;
      uVar51 = *(uint *)&_segNum->field_0xc | 0x40000;
      len = (size_t)uVar51;
      *(uint *)&_segNum->field_0xc = uVar51;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar50);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar50);
      pvE = parasail_memalign___m128i(0x10,(long)iVar50);
      ptr = parasail_memalign___m128i(0x10,(long)iVar50);
      b = parasail_memalign___m128i(0x10,(long)iVar50);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar50);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar50);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar83[0] = (long)iVar50;
        alVar83[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar83,len);
        alVar84[0] = (long)iVar50;
        alVar84[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar84,len);
        alVar85[0] = (long)iVar50;
        alVar85[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar85,len);
        alVar86[0] = (long)iVar50;
        alVar86[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar86,len);
        alVar87[0] = (long)iVar50;
        alVar87[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar87,len);
        c[0] = (long)iVar50;
        c[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c,len);
        h.v[3] = 0;
        for (k = 0; k < iVar50; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            if (s1_beg == 0) {
              local_12d0 = -(gap * (h.v[2] * iVar50 + k)) - open;
            }
            else {
              local_12d0 = 0;
            }
            local_12d8 = local_12d0;
            if ((long)local_12d0 < -0x80000000) {
              local_12d8 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_12d8;
            local_12e0 = (long)local_12d0 - (long)open;
            if (local_12e0 < -0x80000000) {
              local_12e0 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_12e0;
          }
          pvHLoad[h.v[3]][0] = e.m[1];
          pvHLoad[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_12e4 = -(gap * (k + -1)) - open;
          }
          else {
            local_12e4 = 0;
          }
          local_12f0 = local_12e4;
          if (local_12e4 < -0x80000000) {
            local_12f0 = -0x80000000;
          }
          ptr_00[k] = local_12f0;
        }
        vMaxH[1] = lVar19;
        vSaturationCheckMax[0] = lVar20;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xffffffffffffef18 = ZEXT816(0);
          stack0xffffffffffffef08 = ZEXT816(0);
          vFL[0] = 0x100000001;
          vH[1] = 0x100000001;
          uVar64 = pvHLoad[iVar50 + -1][0];
          uVar73 = pvHMLoad[iVar50 + -1][0];
          uVar10 = pvHSLoad[iVar50 + -1][0];
          uVar11 = pvHLLoad[iVar50 + -1][0];
          vH[0] = pvHLoad[iVar50 + -1][1] << 0x20 | uVar64 >> 0x20;
          vHM[0] = pvHMLoad[iVar50 + -1][1] << 0x20 | uVar73 >> 0x20;
          vHS[1] = uVar73 << 0x20;
          vHS[0] = pvHSLoad[iVar50 + -1][1] << 0x20 | uVar10 >> 0x20;
          vHL[1] = uVar10 << 0x20;
          vHL[0] = pvHLLoad[iVar50 + -1][1] << 0x20 | uVar11 >> 0x20;
          vP = (__m128i *)(uVar11 << 0x20);
          vH_dag[1] = uVar64 << 0x20 | (ulong)(uint)ptr_00[s1Len];
          iVar57 = ppVar2->mapper[(byte)s2[s1Len]] * iVar50;
          iVar62 = ppVar2->mapper[(byte)s2[s1Len]];
          iVar63 = ppVar2->mapper[(byte)s2[s1Len]];
          palVar6 = pvHMStore;
          palVar7 = pvHSStore;
          palVar8 = pvHLStore;
          palVar9 = pvE;
          vF_ext[1] = lVar19;
          vF[0] = lVar20;
          for (k = 0; k < iVar50; k = k + 1) {
            lVar12 = ptr[k][0];
            lVar13 = ptr[k][1];
            alVar85 = b[k];
            alVar83 = b[k];
            alVar86 = b_00[k];
            alVar84 = b_00[k];
            palVar55 = b_01 + k;
            lVar14 = (*palVar55)[0];
            lVar15 = (*palVar55)[1];
            alVar87 = *palVar55;
            puVar56 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)iVar57 * 0x10);
            uVar16 = *puVar56;
            uVar17 = puVar56[1];
            local_868 = (int)vH_dag[1];
            iStack_864 = (int)((ulong)vH_dag[1] >> 0x20);
            iStack_860 = (int)vH[0];
            iStack_85c = (int)((ulong)vH[0] >> 0x20);
            local_878 = (int)uVar16;
            iStack_874 = (int)((ulong)uVar16 >> 0x20);
            iStack_870 = (int)uVar17;
            iStack_86c = (int)((ulong)uVar17 >> 0x20);
            uVar51 = local_868 + local_878;
            uVar65 = iStack_864 + iStack_874;
            uVar69 = iStack_860 + iStack_870;
            uVar74 = iStack_85c + iStack_86c;
            local_6d8 = (int)lVar12;
            iStack_6d4 = (int)((ulong)lVar12 >> 0x20);
            iStack_6d0 = (int)lVar13;
            iStack_6cc = (int)((ulong)lVar13 >> 0x20);
            uVar59 = (uint)((int)uVar51 < local_6d8) * local_6d8 |
                     ((int)uVar51 >= local_6d8) * uVar51;
            uVar66 = (uint)((int)uVar65 < iStack_6d4) * iStack_6d4 |
                     ((int)uVar65 >= iStack_6d4) * uVar65;
            uVar70 = (uint)((int)uVar69 < iStack_6d0) * iStack_6d0 |
                     ((int)uVar69 >= iStack_6d0) * uVar69;
            uVar75 = (uint)((int)uVar74 < iStack_6cc) * iStack_6cc |
                     ((int)uVar74 >= iStack_6cc) * uVar74;
            local_6f8 = (uint)vF_ext[1];
            uStack_6f4 = (uint)((ulong)vF_ext[1] >> 0x20);
            uStack_6f0 = (uint)vF[0];
            uStack_6ec = (uint)((ulong)vF[0] >> 0x20);
            uVar59 = ((int)uVar59 < (int)local_6f8) * local_6f8 |
                     ((int)uVar59 >= (int)local_6f8) * uVar59;
            uVar66 = ((int)uVar66 < (int)uStack_6f4) * uStack_6f4 |
                     ((int)uVar66 >= (int)uStack_6f4) * uVar66;
            uVar70 = ((int)uVar70 < (int)uStack_6f0) * uStack_6f0 |
                     ((int)uVar70 >= (int)uStack_6f0) * uVar70;
            uVar75 = ((int)uVar75 < (int)uStack_6ec) * uStack_6ec |
                     ((int)uVar75 >= (int)uStack_6ec) * uVar75;
            vH_dag[1] = CONCAT44(uVar66,uVar59);
            vH[0] = CONCAT44(uVar75,uVar70);
            pvHMStore[k][0] = vH_dag[1];
            pvHMStore[k][1] = vH[0];
            iVar60 = -(uint)(uVar59 == uVar51);
            iVar67 = -(uint)(uVar66 == uVar65);
            iVar71 = -(uint)(uVar70 == uVar69);
            iVar76 = -(uint)(uVar75 == uVar74);
            iVar61 = -(uint)(uVar59 == local_6f8);
            iVar68 = -(uint)(uVar66 == uStack_6f4);
            iVar72 = -(uint)(uVar70 == uStack_6f0);
            iVar77 = -(uint)(uVar75 == uStack_6ec);
            auVar46._4_4_ = iVar68;
            auVar46._0_4_ = iVar61;
            auVar46._12_4_ = iVar77;
            auVar46._8_4_ = iVar72;
            auVar80 = pblendvb((undefined1  [16])alVar85,stack0xffffffffffffef18,auVar46);
            puVar56 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar62 * iVar50) * 0x10)
            ;
            uVar16 = *puVar56;
            uVar17 = puVar56[1];
            local_888 = (int)vHS[1];
            iStack_884 = vHS[1]._4_4_;
            iStack_880 = (int)vHS[2];
            iStack_87c = vHS[2]._4_4_;
            local_898 = (int)uVar16;
            iStack_894 = (int)((ulong)uVar16 >> 0x20);
            iStack_890 = (int)uVar17;
            iStack_88c = (int)((ulong)uVar17 >> 0x20);
            auVar44._4_4_ = iVar67;
            auVar44._0_4_ = iVar60;
            auVar44._12_4_ = iVar76;
            auVar44._8_4_ = iVar71;
            auVar45._4_4_ = iStack_884 + iStack_894;
            auVar45._0_4_ = local_888 + local_898;
            auVar45._8_4_ = iStack_880 + iStack_890;
            auVar45._12_4_ = iStack_87c + iStack_88c;
            auVar80 = pblendvb(auVar80,auVar45,auVar44);
            vHS[1] = auVar80._0_8_;
            vHM[0] = auVar80._8_8_;
            pvHSStore[k][0] = vHS[1];
            pvHSStore[k][1] = vHM[0];
            auVar43._4_4_ = iVar68;
            auVar43._0_4_ = iVar61;
            auVar43._12_4_ = iVar77;
            auVar43._8_4_ = iVar72;
            auVar81 = pblendvb((undefined1  [16])alVar86,stack0xffffffffffffef08,auVar43);
            puVar56 = (undefined8 *)((long)pvVar5 + (long)k * 0x10 + (long)(iVar63 * iVar50) * 0x10)
            ;
            uVar16 = *puVar56;
            uVar17 = puVar56[1];
            local_8a8 = (int)vHL[1];
            iStack_8a4 = vHL[1]._4_4_;
            iStack_8a0 = (int)vHL[2];
            iStack_89c = vHL[2]._4_4_;
            local_8b8 = (int)uVar16;
            iStack_8b4 = (int)((ulong)uVar16 >> 0x20);
            iStack_8b0 = (int)uVar17;
            iStack_8ac = (int)((ulong)uVar17 >> 0x20);
            auVar41._4_4_ = iVar67;
            auVar41._0_4_ = iVar60;
            auVar41._12_4_ = iVar76;
            auVar41._8_4_ = iVar71;
            auVar42._4_4_ = iStack_8a4 + iStack_8b4;
            auVar42._0_4_ = local_8a8 + local_8b8;
            auVar42._8_4_ = iStack_8a0 + iStack_8b0;
            auVar42._12_4_ = iStack_89c + iStack_8ac;
            auVar81 = pblendvb(auVar81,auVar42,auVar41);
            vHL[1] = auVar81._0_8_;
            vHS[0] = auVar81._8_8_;
            pvHLStore[k][0] = vHL[1];
            pvHLStore[k][1] = vHS[0];
            auVar40._4_4_ = iVar68;
            auVar40._0_4_ = iVar61;
            auVar40._12_4_ = iVar77;
            auVar40._8_4_ = iVar72;
            auVar82 = pblendvb((undefined1  [16])alVar87,stack0xffffffffffffeef8,auVar40);
            local_8c8 = (int)vP;
            iStack_8c4 = vP._4_4_;
            iStack_8c0 = vP._8_4_;
            iStack_8bc = vP._12_4_;
            auVar38._4_4_ = iVar67;
            auVar38._0_4_ = iVar60;
            auVar38._12_4_ = iVar76;
            auVar38._8_4_ = iVar71;
            auVar39._4_4_ = iStack_8c4 + 1;
            auVar39._0_4_ = local_8c8 + 1;
            auVar39._8_4_ = iStack_8c0 + 1;
            auVar39._12_4_ = iStack_8bc + 1;
            auVar82 = pblendvb(auVar82,auVar39,auVar38);
            vP = auVar82._0_8_;
            vHL[0] = auVar82._8_8_;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vHL[0];
            local_268 = (int)vSaturationCheckMax[1];
            iStack_264 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_260 = (int)vSaturationCheckMin[0];
            iStack_25c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar66 < iStack_264) * uVar66 |
                          (uint)((int)uVar66 >= iStack_264) * iStack_264,
                          ((int)uVar59 < local_268) * uVar59 |
                          (uint)((int)uVar59 >= local_268) * local_268);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar75 < iStack_25c) * uVar75 |
                          (uint)((int)uVar75 >= iStack_25c) * iStack_25c,
                          ((int)uVar70 < iStack_260) * uVar70 |
                          (uint)((int)uVar70 >= iStack_260) * iStack_260);
            local_708 = (int)vMaxH[1];
            iStack_704 = (int)((ulong)vMaxH[1] >> 0x20);
            iStack_700 = (int)vSaturationCheckMax[0];
            iStack_6fc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            uVar51 = (local_708 < (int)uVar59) * uVar59 |
                     (uint)(local_708 >= (int)uVar59) * local_708;
            uVar65 = (iStack_704 < (int)uVar66) * uVar66 |
                     (uint)(iStack_704 >= (int)uVar66) * iStack_704;
            uVar69 = (iStack_700 < (int)uVar70) * uVar70 |
                     (uint)(iStack_700 >= (int)uVar70) * iStack_700;
            uVar74 = (iStack_6fc < (int)uVar75) * uVar75 |
                     (uint)(iStack_6fc >= (int)uVar75) * iStack_6fc;
            local_738 = auVar80._0_4_;
            iStack_734 = auVar80._4_4_;
            iStack_730 = auVar80._8_4_;
            iStack_72c = auVar80._12_4_;
            uVar51 = (uint)((int)uVar51 < local_738) * local_738 |
                     ((int)uVar51 >= local_738) * uVar51;
            uVar65 = (uint)((int)uVar65 < iStack_734) * iStack_734 |
                     ((int)uVar65 >= iStack_734) * uVar65;
            uVar69 = (uint)((int)uVar69 < iStack_730) * iStack_730 |
                     ((int)uVar69 >= iStack_730) * uVar69;
            uVar74 = (uint)((int)uVar74 < iStack_72c) * iStack_72c |
                     ((int)uVar74 >= iStack_72c) * uVar74;
            local_758 = auVar81._0_4_;
            iStack_754 = auVar81._4_4_;
            iStack_750 = auVar81._8_4_;
            iStack_74c = auVar81._12_4_;
            uVar51 = (uint)((int)uVar51 < local_758) * local_758 |
                     ((int)uVar51 >= local_758) * uVar51;
            uVar65 = (uint)((int)uVar65 < iStack_754) * iStack_754 |
                     ((int)uVar65 >= iStack_754) * uVar65;
            uVar69 = (uint)((int)uVar69 < iStack_750) * iStack_750 |
                     ((int)uVar69 >= iStack_750) * uVar69;
            uVar74 = (uint)((int)uVar74 < iStack_74c) * iStack_74c |
                     ((int)uVar74 >= iStack_74c) * uVar74;
            local_778 = auVar82._0_4_;
            iStack_774 = auVar82._4_4_;
            iStack_770 = auVar82._8_4_;
            iStack_76c = auVar82._12_4_;
            vMaxH[1] = CONCAT44((uint)((int)uVar65 < iStack_774) * iStack_774 |
                                ((int)uVar65 >= iStack_774) * uVar65,
                                (uint)((int)uVar51 < local_778) * local_778 |
                                ((int)uVar51 >= local_778) * uVar51);
            vSaturationCheckMax[0] =
                 CONCAT44((uint)((int)uVar74 < iStack_76c) * iStack_76c |
                          ((int)uVar74 >= iStack_76c) * uVar74,
                          (uint)((int)uVar69 < iStack_770) * iStack_770 |
                          ((int)uVar69 >= iStack_770) * uVar69);
            iVar60 = uVar59 - open;
            iVar67 = uVar66 - open;
            iVar71 = uVar70 - open;
            iVar76 = uVar75 - open;
            local_6d8 = local_6d8 - gap;
            iStack_6d4 = iStack_6d4 - gap;
            iStack_6d0 = iStack_6d0 - gap;
            iStack_6cc = iStack_6cc - gap;
            vE_ext[1] = CONCAT44((uint)(iVar67 < iStack_6d4) * iStack_6d4 |
                                 (uint)(iVar67 >= iStack_6d4) * iVar67,
                                 (uint)(iVar60 < local_6d8) * local_6d8 |
                                 (uint)(iVar60 >= local_6d8) * iVar60);
            vE[0] = CONCAT44((uint)(iVar76 < iStack_6cc) * iStack_6cc |
                             (uint)(iVar76 >= iStack_6cc) * iVar76,
                             (uint)(iVar71 < iStack_6d0) * iStack_6d0 |
                             (uint)(iVar71 >= iStack_6d0) * iVar71);
            iVar61 = -(uint)(local_6d8 < iVar60);
            iVar68 = -(uint)(iStack_6d4 < iVar67);
            iVar72 = -(uint)(iStack_6d0 < iVar71);
            iVar77 = -(uint)(iStack_6cc < iVar76);
            auVar37._4_4_ = iVar68;
            auVar37._0_4_ = iVar61;
            auVar37._12_4_ = iVar77;
            auVar37._8_4_ = iVar72;
            auVar82 = pblendvb((undefined1  [16])alVar83,auVar80,auVar37);
            auVar36._4_4_ = iVar68;
            auVar36._0_4_ = iVar61;
            auVar36._12_4_ = iVar77;
            auVar36._8_4_ = iVar72;
            auVar78 = pblendvb((undefined1  [16])alVar84,auVar81,auVar36);
            local_8e8 = (int)lVar14;
            iStack_8e4 = (int)((ulong)lVar14 >> 0x20);
            iStack_8e0 = (int)lVar15;
            iStack_8dc = (int)((ulong)lVar15 >> 0x20);
            auVar33._4_4_ = iVar68;
            auVar33._0_4_ = iVar61;
            auVar33._12_4_ = iVar77;
            auVar33._8_4_ = iVar72;
            auVar35._4_4_ = iStack_8e4 + 1;
            auVar35._0_4_ = local_8e8 + 1;
            auVar35._8_4_ = iStack_8e0 + 1;
            auVar35._12_4_ = iStack_8dc + 1;
            auVar34._4_4_ = iStack_774 + 1;
            auVar34._0_4_ = local_778 + 1;
            auVar34._8_4_ = iStack_770 + 1;
            auVar34._12_4_ = iStack_76c + 1;
            auVar79 = pblendvb(auVar35,auVar34,auVar33);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar82._0_8_;
            vEM[0] = auVar82._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar78._0_8_;
            vES[0] = auVar78._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar79._0_8_;
            vEL[0] = auVar79._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            iVar61 = local_6f8 - gap;
            iVar68 = uStack_6f4 - gap;
            iVar72 = uStack_6f0 - gap;
            iVar77 = uStack_6ec - gap;
            vF_ext[1] = CONCAT44((uint)(iVar67 < iVar68) * iVar68 |
                                 (uint)(iVar67 >= iVar68) * iVar67,
                                 (uint)(iVar60 < iVar61) * iVar61 |
                                 (uint)(iVar60 >= iVar61) * iVar60);
            vF[0] = CONCAT44((uint)(iVar76 < iVar77) * iVar77 | (uint)(iVar76 >= iVar77) * iVar76,
                             (uint)(iVar71 < iVar72) * iVar72 | (uint)(iVar71 >= iVar72) * iVar71);
            iVar60 = -(uint)(iVar61 < iVar60);
            iVar61 = -(uint)(iVar68 < iVar67);
            iVar67 = -(uint)(iVar72 < iVar71);
            iVar68 = -(uint)(iVar77 < iVar76);
            auVar79._4_4_ = iVar61;
            auVar79._0_4_ = iVar60;
            auVar79._12_4_ = iVar68;
            auVar79._8_4_ = iVar67;
            register0x00001240 = pblendvb(stack0xffffffffffffef18,auVar80,auVar79);
            auVar78._4_4_ = iVar61;
            auVar78._0_4_ = iVar60;
            auVar78._12_4_ = iVar68;
            auVar78._8_4_ = iVar67;
            register0x00001240 = pblendvb(stack0xffffffffffffef08,auVar81,auVar78);
            local_928 = (int)vH[1];
            iStack_924 = vH[1]._4_4_;
            iStack_920 = (int)vH[2];
            iStack_91c = vH[2]._4_4_;
            auVar80._4_4_ = iVar61;
            auVar80._0_4_ = iVar60;
            auVar80._12_4_ = iVar68;
            auVar80._8_4_ = iVar67;
            auVar82._4_4_ = iStack_924 + 1;
            auVar82._0_4_ = local_928 + 1;
            auVar82._8_4_ = iStack_920 + 1;
            auVar82._12_4_ = iStack_91c + 1;
            auVar81._4_4_ = iStack_774 + 1;
            auVar81._0_4_ = local_778 + 1;
            auVar81._8_4_ = iStack_770 + 1;
            auVar81._12_4_ = iStack_76c + 1;
            register0x00001240 = pblendvb(auVar82,auVar81,auVar80);
            vH_dag[1] = pvHLoad[k][0];
            vH[0] = pvHLoad[k][1];
            unique0x10004841 = pvHMLoad[k];
            unique0x10004851 = pvHSLoad[k];
            _vP = pvHLLoad[k];
          }
          for (end_query = 0; end_query < 4; end_query = end_query + 1) {
            uVar64 = pvHLoad[iVar50 + -1][0];
            if (s2_beg == 0) {
              local_12f4 = ptr_00[s1Len + 1] - open;
            }
            else {
              local_12f4 = -open;
            }
            local_1300 = local_12f4;
            if (local_12f4 < -0x80000000) {
              local_1300 = -0x80000000;
            }
            vHp[0] = pvHLoad[iVar50 + -1][1] << 0x20 | uVar64 >> 0x20;
            vF[0] = vF[0] << 0x20 | (ulong)vF_ext[1] >> 0x20;
            vFM[0] = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
            vFS[1] = vFS[1] << 0x20;
            vFS[0] = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
            vFL[1] = vFL[1] << 0x20;
            tmp_6 = CONCAT44((int)uVar64,ptr_00[s1Len]);
            vF_ext[1]._4_4_ = (undefined4)vF_ext[1];
            vF_ext[1] = CONCAT44(vF_ext[1]._4_4_,local_1300);
            vFL[0] = vFL[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20 | 1;
            for (k = 0; k < iVar50; k = k + 1) {
              puVar56 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)iVar57 * 0x10);
              uVar16 = *puVar56;
              uVar17 = puVar56[1];
              local_968 = (int)tmp_6;
              iStack_964 = (int)((ulong)tmp_6 >> 0x20);
              iStack_960 = (int)vHp[0];
              iStack_95c = (int)((ulong)vHp[0] >> 0x20);
              local_978 = (int)uVar16;
              iStack_974 = (int)((ulong)uVar16 >> 0x20);
              iStack_970 = (int)uVar17;
              iStack_96c = (int)((ulong)uVar17 >> 0x20);
              lVar12 = pvHMStore[k][0];
              lVar13 = pvHMStore[k][1];
              local_7c8 = (int)lVar12;
              iStack_7c4 = (int)((ulong)lVar12 >> 0x20);
              iStack_7c0 = (int)lVar13;
              iStack_7bc = (int)((ulong)lVar13 >> 0x20);
              local_7d8 = (uint)vF_ext[1];
              uStack_7d4 = (uint)((ulong)vF_ext[1] >> 0x20);
              uStack_7d0 = (uint)vF[0];
              uStack_7cc = (uint)((ulong)vF[0] >> 0x20);
              uVar51 = (local_7c8 < (int)local_7d8) * local_7d8 |
                       (uint)(local_7c8 >= (int)local_7d8) * local_7c8;
              uVar65 = (iStack_7c4 < (int)uStack_7d4) * uStack_7d4 |
                       (uint)(iStack_7c4 >= (int)uStack_7d4) * iStack_7c4;
              uVar69 = (iStack_7c0 < (int)uStack_7d0) * uStack_7d0 |
                       (uint)(iStack_7c0 >= (int)uStack_7d0) * iStack_7c0;
              uVar74 = (iStack_7bc < (int)uStack_7cc) * uStack_7cc |
                       (uint)(iStack_7bc >= (int)uStack_7cc) * iStack_7bc;
              vH_dag[1] = CONCAT44(uVar65,uVar51);
              vH[0] = CONCAT44(uVar74,uVar69);
              pvHMStore[k][0] = vH_dag[1];
              pvHMStore[k][1] = vH[0];
              uVar64 = ~CONCAT44(-(uint)(uVar65 == iStack_964 + iStack_974),
                                 -(uint)(uVar51 == local_968 + local_978)) &
                       CONCAT44(-(uint)(uVar65 == uStack_7d4),-(uint)(uVar51 == local_7d8));
              uVar73 = ~CONCAT44(-(uint)(uVar74 == iStack_95c + iStack_96c),
                                 -(uint)(uVar69 == iStack_960 + iStack_970)) &
                       CONCAT44(-(uint)(uVar74 == uStack_7cc),-(uint)(uVar69 == uStack_7d0));
              auVar32._8_8_ = uVar73;
              auVar32._0_8_ = uVar64;
              auVar80 = pblendvb((undefined1  [16])pvHSStore[k],stack0xffffffffffffef18,auVar32);
              vHS[1] = auVar80._0_8_;
              vHM[0] = auVar80._8_8_;
              pvHSStore[k][0] = vHS[1];
              pvHSStore[k][1] = vHM[0];
              auVar31._8_8_ = uVar73;
              auVar31._0_8_ = uVar64;
              auVar81 = pblendvb((undefined1  [16])pvHLStore[k],stack0xffffffffffffef08,auVar31);
              vHL[1] = auVar81._0_8_;
              vHS[0] = auVar81._8_8_;
              pvHLStore[k][0] = vHL[1];
              pvHLStore[k][1] = vHS[0];
              auVar30._8_8_ = uVar73;
              auVar30._0_8_ = uVar64;
              auVar82 = pblendvb((undefined1  [16])pvE[k],stack0xffffffffffffeef8,auVar30);
              vP = auVar82._0_8_;
              vHL[0] = auVar82._8_8_;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vHL[0];
              local_288 = (int)vSaturationCheckMax[1];
              iStack_284 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_280 = (int)vSaturationCheckMin[0];
              iStack_27c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44(((int)uVar65 < iStack_284) * uVar65 |
                            (uint)((int)uVar65 >= iStack_284) * iStack_284,
                            ((int)uVar51 < local_288) * uVar51 |
                            (uint)((int)uVar51 >= local_288) * local_288);
              vSaturationCheckMin[0] =
                   CONCAT44(((int)uVar74 < iStack_27c) * uVar74 |
                            (uint)((int)uVar74 >= iStack_27c) * iStack_27c,
                            ((int)uVar69 < iStack_280) * uVar69 |
                            (uint)((int)uVar69 >= iStack_280) * iStack_280);
              local_7e8 = (int)vMaxH[1];
              iStack_7e4 = (int)((ulong)vMaxH[1] >> 0x20);
              iStack_7e0 = (int)vSaturationCheckMax[0];
              iStack_7dc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              uVar59 = (local_7e8 < (int)uVar51) * uVar51 |
                       (uint)(local_7e8 >= (int)uVar51) * local_7e8;
              uVar66 = (iStack_7e4 < (int)uVar65) * uVar65 |
                       (uint)(iStack_7e4 >= (int)uVar65) * iStack_7e4;
              uVar70 = (iStack_7e0 < (int)uVar69) * uVar69 |
                       (uint)(iStack_7e0 >= (int)uVar69) * iStack_7e0;
              uVar75 = (iStack_7dc < (int)uVar74) * uVar74 |
                       (uint)(iStack_7dc >= (int)uVar74) * iStack_7dc;
              local_818 = auVar80._0_4_;
              iStack_814 = auVar80._4_4_;
              iStack_810 = auVar80._8_4_;
              iStack_80c = auVar80._12_4_;
              uVar59 = (uint)((int)uVar59 < local_818) * local_818 |
                       ((int)uVar59 >= local_818) * uVar59;
              uVar66 = (uint)((int)uVar66 < iStack_814) * iStack_814 |
                       ((int)uVar66 >= iStack_814) * uVar66;
              uVar70 = (uint)((int)uVar70 < iStack_810) * iStack_810 |
                       ((int)uVar70 >= iStack_810) * uVar70;
              uVar75 = (uint)((int)uVar75 < iStack_80c) * iStack_80c |
                       ((int)uVar75 >= iStack_80c) * uVar75;
              local_838 = auVar81._0_4_;
              iStack_834 = auVar81._4_4_;
              iStack_830 = auVar81._8_4_;
              iStack_82c = auVar81._12_4_;
              uVar59 = (uint)((int)uVar59 < local_838) * local_838 |
                       ((int)uVar59 >= local_838) * uVar59;
              uVar66 = (uint)((int)uVar66 < iStack_834) * iStack_834 |
                       ((int)uVar66 >= iStack_834) * uVar66;
              uVar70 = (uint)((int)uVar70 < iStack_830) * iStack_830 |
                       ((int)uVar70 >= iStack_830) * uVar70;
              uVar75 = (uint)((int)uVar75 < iStack_82c) * iStack_82c |
                       ((int)uVar75 >= iStack_82c) * uVar75;
              local_858 = auVar82._0_4_;
              iStack_854 = auVar82._4_4_;
              iStack_850 = auVar82._8_4_;
              iStack_84c = auVar82._12_4_;
              vMaxH[1] = CONCAT44((uint)((int)uVar66 < iStack_854) * iStack_854 |
                                  ((int)uVar66 >= iStack_854) * uVar66,
                                  (uint)((int)uVar59 < local_858) * local_858 |
                                  ((int)uVar59 >= local_858) * uVar59);
              vSaturationCheckMax[0] =
                   CONCAT44((uint)((int)uVar75 < iStack_84c) * iStack_84c |
                            ((int)uVar75 >= iStack_84c) * uVar75,
                            (uint)((int)uVar70 < iStack_850) * iStack_850 |
                            ((int)uVar70 >= iStack_850) * uVar70);
              iVar62 = uVar51 - open;
              iVar60 = uVar65 - open;
              iVar67 = uVar69 - open;
              iVar71 = uVar74 - open;
              iVar63 = local_7d8 - gap;
              iVar61 = uStack_7d4 - gap;
              iVar68 = uStack_7d0 - gap;
              iVar72 = uStack_7cc - gap;
              uVar64 = CONCAT44(-(uint)(iVar71 < iVar72),-(uint)(iVar67 < iVar68)) |
                       CONCAT44(-(uint)(iVar72 == iVar71),-(uint)(iVar68 == iVar67));
              auVar49._8_8_ = uVar64;
              auVar49._0_8_ =
                   CONCAT44(-(uint)(iVar60 < iVar61),-(uint)(iVar62 < iVar63)) |
                   CONCAT44(-(uint)(iVar61 == iVar60),-(uint)(iVar63 == iVar62));
              if ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar49 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uVar64 >> 7 & 1) == 0) && (uVar64 >> 0xf & 1) == 0) &&
                      (uVar64 >> 0x17 & 1) == 0) && (uVar64 >> 0x1f & 1) == 0) &&
                    (uVar64 >> 0x27 & 1) == 0) && (uVar64 >> 0x2f & 1) == 0) &&
                  (uVar64 >> 0x37 & 1) == 0) && -1 < (long)uVar64) goto LAB_00aee49c;
              vF_ext[1] = CONCAT44(iVar61,iVar63);
              vF[0] = CONCAT44(iVar72,iVar68);
              cond_max[1] = CONCAT44(-(uint)(iVar61 < iVar60),-(uint)(iVar63 < iVar62));
              cond[0] = CONCAT44(-(uint)(iVar72 < iVar71),-(uint)(iVar68 < iVar67));
              auVar29._8_8_ = cond[0];
              auVar29._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef18,auVar80,auVar29);
              auVar28._8_8_ = cond[0];
              auVar28._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef08,auVar81,auVar28);
              local_988 = (int)vH[1];
              iStack_984 = vH[1]._4_4_;
              iStack_980 = (int)vH[2];
              iStack_97c = vH[2]._4_4_;
              auVar27._4_4_ = iStack_984 + 1;
              auVar27._0_4_ = local_988 + 1;
              auVar27._8_4_ = iStack_980 + 1;
              auVar27._12_4_ = iStack_97c + 1;
              auVar26._4_4_ = iStack_854 + 1;
              auVar26._0_4_ = local_858 + 1;
              auVar26._8_4_ = iStack_850 + 1;
              auVar26._12_4_ = iStack_84c + 1;
              auVar25._8_8_ = cond[0];
              auVar25._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(auVar27,auVar26,auVar25);
              tmp_6 = pvHLoad[k][0];
              vHp[0] = pvHLoad[k][1];
            }
          }
LAB_00aee49c:
          palVar55 = pvHMStore + iVar58;
          vH_dag[1] = (*palVar55)[0];
          vH[0] = (*palVar55)[1];
          unique0x10004951 = pvHSStore[iVar58];
          unique0x10004961 = pvHLStore[iVar58];
          _vP = pvE[iVar58];
          local_188 = (int)vH_dag[1];
          iStack_184 = (int)((ulong)vH_dag[1] >> 0x20);
          iStack_180 = (int)vH[0];
          iStack_17c = (int)((ulong)vH[0] >> 0x20);
          local_198 = (int)vMaxHM[1];
          iStack_194 = vMaxHM[1]._4_4_;
          iStack_190 = (int)vMaxHM[2];
          iStack_18c = vMaxHM[2]._4_4_;
          iVar62 = -(uint)(local_198 < local_188);
          iVar63 = -(uint)(iStack_194 < iStack_184);
          iVar57 = -(uint)(iStack_190 < iStack_180);
          iVar60 = -(uint)(iStack_18c < iStack_17c);
          auVar24._4_4_ = iVar63;
          auVar24._0_4_ = iVar62;
          auVar24._12_4_ = iVar60;
          auVar24._8_4_ = iVar57;
          register0x00001240 = pblendvb(stack0xfffffffffffff028,(undefined1  [16])*palVar55,auVar24)
          ;
          auVar23._4_4_ = iVar63;
          auVar23._0_4_ = iVar62;
          auVar23._12_4_ = iVar60;
          auVar23._8_4_ = iVar57;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff018,(undefined1  [16])pvHSStore[iVar58],auVar23);
          auVar22._4_4_ = iVar63;
          auVar22._0_4_ = iVar62;
          auVar22._12_4_ = iVar60;
          auVar22._8_4_ = iVar57;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff008,(undefined1  [16])pvHLStore[iVar58],auVar22);
          auVar21._4_4_ = iVar63;
          auVar21._0_4_ = iVar62;
          auVar21._12_4_ = iVar60;
          auVar21._8_4_ = iVar57;
          register0x00001240 =
               pblendvb(stack0xffffffffffffeff8,(undefined1  [16])pvE[iVar58],auVar21);
          auVar18._8_4_ = (int)vPosMask[0];
          auVar18._0_8_ = CONCAT44(result._4_4_,(int)result);
          auVar18._12_4_ = vPosMask[0]._4_4_;
          uStack_50 = auVar18._8_8_;
          uStack_50 = uStack_50 & CONCAT44(iVar60,iVar57);
          auVar48._8_8_ = uStack_50;
          auVar48._0_8_ = CONCAT44(result._4_4_,(int)result) & CONCAT44(iVar63,iVar62);
          if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uStack_50 >> 7 & 1) != 0) || (uStack_50 >> 0xf & 1) != 0) ||
                  (uStack_50 >> 0x17 & 1) != 0) || (uStack_50 >> 0x1f & 1) != 0) ||
                (uStack_50 >> 0x27 & 1) != 0) || (uStack_50 >> 0x2f & 1) != 0) ||
              (uStack_50 >> 0x37 & 1) != 0) || (long)uStack_50 < 0) {
            matrix._0_4_ = s1Len;
          }
          for (end_query = 0; end_query < iVar52; end_query = end_query + 1) {
            vH[0] = vH[0] << 0x20 | (ulong)vH_dag[1] >> 0x20;
            vHM[0] = vHM[0] << 0x20 | (ulong)vHS[1] >> 0x20;
            vHS[1] = vHS[1] << 0x20;
            vHS[0] = vHS[0] << 0x20 | (ulong)vHL[1] >> 0x20;
            vHL[1] = vHL[1] << 0x20;
            vHL[0] = vHL[0] << 0x20 | (ulong)vP >> 0x20;
            vP = (__m128i *)((long)vP << 0x20);
            vH_dag[1] = vH_dag[1] << 0x20;
          }
          *(undefined4 *)
           (*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
             trace_del_table + (long)s1Len * 4) = vH[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            trace->trace_del_table + 8) + (long)s1Len * 4) = vHM[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            trace->trace_del_table + 0x10) + (long)s1Len * 4) = vHS[0]._4_4_;
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            trace->trace_del_table + 0x18) + (long)s1Len * 4) = vHL[0]._4_4_;
          pvE = pvHLLoad;
          pvHLLoad = palVar9;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar8;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar7;
          pvHMStore = pvHLoad;
          pvHLoad = palVar6;
        }
        for (k = 0; k < iVar50; k = k + 1) {
          t_00 = k * 0x10;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = iVar50;
          vH_00[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x20),vH_00,t_00
                        ,iVar54);
          vH_01[0] = (ulong)(uint)k;
          vH_01[1]._0_4_ = iVar50;
          vH_01[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x28),vH_01,t_00
                        ,iVar54);
          vH_02[0] = (ulong)(uint)k;
          vH_02[1]._0_4_ = iVar50;
          vH_02[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x30),vH_02,t_00
                        ,iVar54);
          vH_03[0] = (ulong)(uint)k;
          vH_03[1]._0_4_ = iVar50;
          vH_03[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x38),vH_03,t_00
                        ,iVar54);
        }
        similar = local_12cc;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar52; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 0x20 | (ulong)vMaxHM[1] >> 0x20;
            vMaxHM[1] = vMaxHM[1] << 0x20;
            vMaxHM[0] = vMaxHM[0] << 0x20 | (ulong)vMaxHS[1] >> 0x20;
            vMaxHS[1] = vMaxHS[1] << 0x20;
            vMaxHS[0] = vMaxHS[0] << 0x20 | (ulong)vMaxHL[1] >> 0x20;
            vMaxHL[1] = vMaxHL[1] << 0x20;
            vMaxHL[0] = vMaxHL[0] << 0x20 | (ulong)vPosMask[1] >> 0x20;
            vPosMask[1] = vPosMask[1] << 0x20;
          }
          similar = vMaxH[0]._4_4_;
          length = vMaxHM[0]._4_4_;
          vNegLimit[1]._4_4_ = vMaxHS[0]._4_4_;
          vNegLimit[1]._0_4_ = vMaxHL[0]._4_4_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          m = (int32_t *)pvHLoad;
          s = (int32_t *)pvHMLoad;
          l = (int32_t *)pvHSLoad;
          _temp = pvHLLoad;
          for (k = 0; k < iVar50 * 4; k = k + 1) {
            iVar54 = k / 4 + (k % 4) * iVar50;
            if (iVar54 < iVar1) {
              if (similar < *m) {
                similar = *m;
                matrix._0_4_ = s2Len + -1;
                length = *s;
                vNegLimit[1]._4_4_ = *l;
                vNegLimit[1]._0_4_ = (int)(*_temp)[0];
                matrix._4_4_ = iVar54;
              }
              else if (((*m == similar) && ((int)matrix == s2Len + -1)) && (iVar54 < matrix._4_4_))
              {
                length = *s;
                vNegLimit[1]._4_4_ = *l;
                vNegLimit[1]._0_4_ = (int)(*_temp)[0];
                matrix._4_4_ = iVar54;
              }
            }
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_2[0] = pvHLoad[iVar58][1];
          vHM_2[0] = pvHMLoad[iVar58][1];
          vHS_2[0] = pvHSLoad[iVar58][1];
          vHL_2[0] = pvHLLoad[iVar58][1];
          uStack_12c8 = pvHLLoad[iVar58][0];
          vHL_2[1] = pvHSLoad[iVar58][0];
          vHS_2[1] = pvHMLoad[iVar58][0];
          vHM_2[1] = pvHLoad[iVar58][0];
          for (end_query = 0; end_query < iVar52; end_query = end_query + 1) {
            vH_2[0] = vH_2[0] << 0x20 | (ulong)vHM_2[1] >> 0x20;
            vHM_2[0] = vHM_2[0] << 0x20 | (ulong)vHS_2[1] >> 0x20;
            vHS_2[0] = vHS_2[0] << 0x20 | (ulong)vHL_2[1] >> 0x20;
            vHL_2[0] = vHL_2[0] << 0x20 | uStack_12c8 >> 0x20;
            uStack_12c8 = uStack_12c8 << 0x20;
            vHL_2[1] = vHL_2[1] << 0x20;
            vHS_2[1] = vHS_2[1] << 0x20;
            vHM_2[1] = vHM_2[1] << 0x20;
          }
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
          similar = vH_2[0]._4_4_;
          length = vHM_2[0]._4_4_;
          vNegLimit[1]._4_4_ = vHS_2[0]._4_4_;
          vNegLimit[1]._0_4_ = vHL_2[0]._4_4_;
        }
        local_28 = (int)vSaturationCheckMax[1];
        iStack_24 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_20 = (int)vSaturationCheckMin[0];
        iStack_1c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_1a8 = (int)vMaxH[1];
        iStack_1a4 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_1a0 = (int)vSaturationCheckMax[0];
        iStack_19c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar64 = CONCAT44(-(uint)(iStack_1c < local_12cc),-(uint)(iStack_20 < local_12cc)) |
                 CONCAT44(-(uint)(iVar53 < iStack_19c),-(uint)(iVar53 < iStack_1a0));
        auVar47._8_8_ = uVar64;
        auVar47._0_8_ =
             CONCAT44(-(uint)(iStack_24 < local_12cc),-(uint)(local_28 < local_12cc)) |
             CONCAT44(-(uint)(iVar53 < iStack_1a4),-(uint)(iVar53 < local_1a8));
        if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar64 >> 7 & 1) != 0) || (uVar64 >> 0xf & 1) != 0) || (uVar64 >> 0x17 & 1) != 0)
               || (uVar64 >> 0x1f & 1) != 0) || (uVar64 >> 0x27 & 1) != 0) ||
             (uVar64 >> 0x2f & 1) != 0) || (uVar64 >> 0x37 & 1) != 0) || (long)uVar64 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int32_t *)&_segNum->s1 = similar;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->matches = length
        ;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             vNegLimit[1]._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}